

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int attach_set_properties(ATTACH_HANDLE attach,fields properties_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE properties_amqp_value;
  ATTACH_INSTANCE *attach_instance;
  int result;
  fields properties_value_local;
  ATTACH_HANDLE attach_local;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    attach_instance._4_4_ = 0x14bd;
  }
  else {
    item_value = amqpvalue_create_fields(properties_value);
    if (item_value == (AMQP_VALUE)0x0) {
      attach_instance._4_4_ = 0x14c5;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(attach->composite_value,0xd,item_value);
      if (iVar1 == 0) {
        attach_instance._4_4_ = 0;
      }
      else {
        attach_instance._4_4_ = 0x14cb;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return attach_instance._4_4_;
}

Assistant:

int attach_set_properties(ATTACH_HANDLE attach, fields properties_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        AMQP_VALUE properties_amqp_value = amqpvalue_create_fields(properties_value);
        if (properties_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(attach_instance->composite_value, 13, properties_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(properties_amqp_value);
        }
    }

    return result;
}